

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall IndexNode<int>::IndexNode(IndexNode<int> *this,int N)

{
  vector<Addr,_std::allocator<Addr>_> *pvVar1;
  pointer pAVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  size_type __n;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> *local_50;
  _Vector_base<Addr,_std::allocator<Addr>_> local_48;
  
  pvVar1 = &this->p;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (undefined1  [16])0x0;
  (this->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->k).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->p).super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __n = (size_type)N;
  local_50 = &this->k;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,__n,&local_51);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->k);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_48);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_48,__n,(allocator_type *)&local_51);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&this->v,&local_48);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&local_48);
  std::vector<Addr,_std::allocator<Addr>_>::vector
            ((vector<Addr,_std::allocator<Addr>_> *)&local_48,__n,(allocator_type *)&local_51);
  std::vector<Addr,_std::allocator<Addr>_>::_M_move_assign(pvVar1,&local_48);
  std::_Vector_base<Addr,_std::allocator<Addr>_>::~_Vector_base(&local_48);
  this->NodeState = '0';
  uVar5 = N - 1;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = (ulong)uVar5;
  }
  (this->parent).BlockNum = -1;
  (this->parent).FileOff = -1;
  (this->self).BlockNum = -1;
  (this->self).FileOff = -1;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    (this->v).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3] = '0';
    pAVar2 = (pvVar1->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.
             super__Vector_impl_data._M_start + uVar3;
    pAVar2->BlockNum = -1;
    pAVar2->FileOff = -1;
  }
  pAVar2 = (pvVar1->super__Vector_base<Addr,_std::allocator<Addr>_>)._M_impl.super__Vector_impl_data
           ._M_start + (int)uVar5;
  pAVar2->BlockNum = -1;
  pAVar2->FileOff = -1;
  return;
}

Assistant:

IndexNode<K>::IndexNode(int N) {
	int i;
	k = vector<K>(N);
	v = vector<char>(N);
	p = vector<Addr>(N);
	this->NodeState = INTERNAL;
	this->parent = { -1, -1 };
	this->self = { -1, -1 };
	for (i = 0; i < N - 1; i++) {
		this->v[i] = '0';
		this->p[i] = { -1, -1 };
	}
	this->p[N - 1] = { -1, -1 };
}